

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int ns_socketpair2(sock_t *sp,int sock_type)

{
  int iVar1;
  int local_34;
  int local_30;
  socklen_t local_2c;
  int ret;
  socklen_t len;
  sock_t sock;
  socket_address sa;
  int sock_type_local;
  sock_t *sp_local;
  
  local_2c = 0x10;
  local_30 = 0;
  sp[1] = -1;
  *sp = -1;
  sa._8_4_ = sock_type;
  unique0x10000215 = sp;
  memset(&len,0,0x10);
  len._0_2_ = 2;
  len._2_2_ = htons(0);
  sock = htonl(0x7f000001);
  ret = socket(2,sa._8_4_,0);
  if (ret != -1) {
    iVar1 = bind(ret,(sockaddr *)&len,local_2c);
    if (iVar1 == 0) {
      if (sa._8_4_ != 2) {
        iVar1 = listen(ret,1);
        if (iVar1 != 0) goto LAB_00105093;
      }
      iVar1 = getsockname(ret,(sockaddr *)&len,&local_2c);
      if (iVar1 == 0) {
        iVar1 = socket(2,sa._8_4_,0);
        *stack0xfffffffffffffff0 = iVar1;
        if (iVar1 != -1) {
          iVar1 = connect(*stack0xfffffffffffffff0,(sockaddr *)&len,local_2c);
          if (iVar1 == 0) {
            if (sa._8_4_ == 1) {
LAB_00105043:
              if (sa._8_4_ == 2) {
                local_34 = ret;
              }
              else {
                local_34 = accept(ret,(sockaddr *)&len,&local_2c);
              }
              stack0xfffffffffffffff0[1] = local_34;
              if (local_34 != -1) {
                ns_set_close_on_exec(*stack0xfffffffffffffff0);
                ns_set_close_on_exec(stack0xfffffffffffffff0[1]);
                local_30 = 1;
                goto LAB_001050d2;
              }
            }
            else {
              iVar1 = getsockname(*stack0xfffffffffffffff0,(sockaddr *)&len,&local_2c);
              if (iVar1 == 0) {
                iVar1 = connect(ret,(sockaddr *)&len,local_2c);
                if (iVar1 == 0) goto LAB_00105043;
              }
            }
          }
        }
      }
    }
  }
LAB_00105093:
  if (*stack0xfffffffffffffff0 != -1) {
    close(*stack0xfffffffffffffff0);
  }
  if (stack0xfffffffffffffff0[1] != -1) {
    close(stack0xfffffffffffffff0[1]);
  }
  stack0xfffffffffffffff0[1] = -1;
  *stack0xfffffffffffffff0 = -1;
LAB_001050d2:
  if (sa._8_4_ != 2) {
    close(ret);
  }
  return local_30;
}

Assistant:

int ns_socketpair2(sock_t sp[2], int sock_type) {
  union socket_address sa;
  sock_t sock;
  socklen_t len = sizeof(sa.sin);
  int ret = 0;

  sp[0] = sp[1] = INVALID_SOCKET;

  (void) memset(&sa, 0, sizeof(sa));
  sa.sin.sin_family = AF_INET;
  sa.sin.sin_port = htons(0);
  sa.sin.sin_addr.s_addr = htonl(0x7f000001);

  if ((sock = socket(AF_INET, sock_type, 0)) != INVALID_SOCKET &&
      !bind(sock, &sa.sa, len) &&
      (sock_type == SOCK_DGRAM || !listen(sock, 1)) &&
      !getsockname(sock, &sa.sa, &len) &&
      (sp[0] = socket(AF_INET, sock_type, 0)) != INVALID_SOCKET &&
      !connect(sp[0], &sa.sa, len) &&
      (sock_type == SOCK_STREAM ||
       (!getsockname(sp[0], &sa.sa, &len) && !connect(sock, &sa.sa, len))) &&
      (sp[1] = (sock_type == SOCK_DGRAM ? sock :
                accept(sock, &sa.sa, &len))) != INVALID_SOCKET) {
    ns_set_close_on_exec(sp[0]);
    ns_set_close_on_exec(sp[1]);
    ret = 1;
  } else {
    if (sp[0] != INVALID_SOCKET) closesocket(sp[0]);
    if (sp[1] != INVALID_SOCKET) closesocket(sp[1]);
    sp[0] = sp[1] = INVALID_SOCKET;
  }
  if (sock_type != SOCK_DGRAM) closesocket(sock);

  return ret;
}